

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O2

uint64_t __thiscall kratos::Generator::child_count(Generator *this)

{
  uint64_t uVar1;
  
  if (this->is_external_ == false) {
    uVar1 = (this->children_)._M_h._M_element_count +
            (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count +
            ((long)(this->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->stmts_).
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
  else {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint64_t inline child_count() override {
        return is_external_ ? 0 : stmts_count() + funcs_.size() + get_child_generator_size();
    }